

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O1

void __thiscall PrintC::opReturn(PrintC *this,PcodeOp *op)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EmitXml *pEVar2;
  uint uVar3;
  char *pcVar4;
  string nm;
  string local_88;
  string local_68;
  Atom local_48;
  
  paVar1 = &local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  uVar3 = op->flags & 0x3e00000;
  pcVar4 = "halt";
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if (uVar3 < 0x800000) {
    if (uVar3 != 0x200000) {
      if (uVar3 != 0x400000) {
LAB_00301745:
        pEVar2 = (this->super_PrintLanguage).emit;
        (*pEVar2->_vptr_EmitXml[0x13])(pEVar2,"return",0,op,4);
        if (1 < (int)((ulong)((long)(op->inrefs).
                                    super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(op->inrefs).
                                   super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                                   .super__Vector_impl_data._M_start) >> 3)) {
          pEVar2 = (this->super_PrintLanguage).emit;
          (*pEVar2->_vptr_EmitXml[0x21])(pEVar2,1,0);
          PrintLanguage::pushVnImplied
                    (&this->super_PrintLanguage,
                     (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                     super__Vector_impl_data._M_start[1],op,(this->super_PrintLanguage).mods);
        }
        goto LAB_0030172a;
      }
      pcVar4 = "halt_baddata";
    }
  }
  else if (uVar3 == 0x800000) {
    pcVar4 = "halt_unimplemented";
  }
  else if (uVar3 != 0x1000000) {
    if (uVar3 != 0x2000000) goto LAB_00301745;
    pcVar4 = "halt_missing";
  }
  std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)0x0,(ulong)pcVar4);
  PrintLanguage::pushOp(&this->super_PrintLanguage,&function_call,op);
  local_48.type = optoken;
  local_48.highlight = funcname_color;
  local_48.name = &local_68;
  local_48.op = op;
  PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_48);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  local_48.type = blanktoken;
  local_48.highlight = no_color;
  local_48.name = &local_88;
  PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
LAB_0030172a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void PrintC::opReturn(const PcodeOp *op)

{
  string nm;
  switch(op->getHaltType()) {
  default:			// The most common case, plain return
  // FIXME:  This routine shouldn't emit directly
    emit->tagOp("return",EmitXml::keyword_color,op);
    if (op->numInput()>1) {
      emit->spaces(1);
      pushVnImplied(op->getIn(1),op,mods);
    }
    return;
  case PcodeOp::noreturn:	// Previous instruction does not exit
  case PcodeOp::halt:		// Process halts
    nm = "halt";
    break;
  case PcodeOp::badinstruction:
    nm = "halt_baddata";	// CPU executes bad instruction
    break;
  case PcodeOp::unimplemented:	// instruction is unimplemented
    nm = "halt_unimplemented";
    break;
  case PcodeOp::missing:	// Did not analyze this instruction
    nm = "halt_missing";
    break;
  }
  pushOp(&function_call,op);
  pushAtom(Atom(nm,optoken,EmitXml::funcname_color,op));
  pushAtom(Atom("",blanktoken,EmitXml::no_color));
}